

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

CURLcode Curl_hsts_parse(hsts *h,char *hostname,char *header)

{
  bool bVar1;
  bool bVar2;
  char *hostname_00;
  hsts *h_00;
  _Bool _Var3;
  byte bVar4;
  int iVar5;
  CURLofft CVar6;
  CURLcode CVar7;
  time_t tVar8;
  stsentry *psVar9;
  long lVar10;
  byte *pbVar11;
  bool subdomains;
  curl_off_t expires;
  char *endp;
  curl_off_t local_58;
  time_t local_50;
  char *local_48;
  hsts *local_40;
  byte *local_38;
  
  local_58 = 0;
  CVar7 = CURLE_OK;
  tVar8 = time((time_t *)0x0);
  _Var3 = Curl_host_is_ipnum(hostname);
  if (!_Var3) {
    bVar2 = false;
    subdomains = false;
    local_50 = tVar8;
    local_48 = hostname;
    local_40 = h;
    do {
      bVar4 = *header;
      while ((bVar4 != 0 && (iVar5 = Curl_isspace((uint)bVar4), iVar5 != 0))) {
        bVar4 = ((byte *)header)[1];
        header = (char *)((byte *)header + 1);
      }
      iVar5 = Curl_strncasecompare("max-age=",header,8);
      if (iVar5 == 0) {
        iVar5 = Curl_strncasecompare("includesubdomains",header,0x11);
        if (iVar5 == 0) {
          for (; (*header != 0 && (*header != 0x3b)); header = (char *)((byte *)header + 1)) {
          }
        }
        else {
          if (subdomains) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          header = (char *)((byte *)header + 0x11);
          subdomains = true;
        }
      }
      else {
        if (bVar2) {
LAB_00121fd4:
          bVar1 = false;
        }
        else {
          bVar4 = ((byte *)header)[8];
          pbVar11 = (byte *)header + 8;
          while ((bVar4 != 0 && (iVar5 = Curl_isspace((uint)bVar4), iVar5 != 0))) {
            bVar4 = pbVar11[1];
            pbVar11 = pbVar11 + 1;
          }
          bVar4 = *pbVar11;
          CVar6 = curlx_strtoofft((char *)(pbVar11 + (bVar4 == 0x22)),(char **)&local_38,10,
                                  &local_58);
          if (CVar6 != CURL_OFFT_OK) {
            header = (char *)(pbVar11 + (bVar4 == 0x22));
            if (CVar6 != CURL_OFFT_FLOW) goto LAB_00121fd4;
            local_58 = 0x7fffffffffffffff;
          }
          bVar1 = true;
          header = (char *)local_38;
          if (bVar4 == 0x22) {
            if (*local_38 != 0x22) goto LAB_00121fd4;
            bVar2 = true;
            bVar1 = true;
            header = (char *)(local_38 + 1);
          }
          else {
            bVar2 = true;
          }
        }
        if (!bVar1) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
      }
      bVar4 = *header;
      while ((bVar4 != 0 && (iVar5 = Curl_isspace((uint)bVar4), iVar5 != 0))) {
        bVar4 = ((byte *)header)[1];
        header = (char *)((byte *)header + 1);
      }
      h_00 = local_40;
      hostname_00 = local_48;
      pbVar11 = (byte *)header + (*header == 0x3bU);
      header = (char *)((byte *)header + (*header == 0x3bU));
    } while (*pbVar11 != 0);
    CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
    if (bVar2) {
      if (local_58 == 0) {
        CVar7 = CURLE_OK;
        psVar9 = Curl_hsts(local_40,local_48,false);
        if (psVar9 != (stsentry *)0x0) {
          CVar7 = CURLE_OK;
          Curl_llist_remove(&h_00->list,&psVar9->node,(void *)0x0);
          (*Curl_cfree)(psVar9->host);
          (*Curl_cfree)(psVar9);
        }
      }
      else {
        lVar10 = local_50 + local_58;
        if (0x7fffffffffffffff - local_50 < local_58) {
          lVar10 = 0x7fffffffffffffff;
        }
        CVar7 = CURLE_OK;
        local_58 = lVar10;
        psVar9 = Curl_hsts(local_40,local_48,false);
        if (psVar9 == (stsentry *)0x0) {
          CVar7 = hsts_create(h_00,hostname_00,subdomains,local_58);
        }
        else {
          psVar9->expires = local_58;
          psVar9->includeSubDomains = subdomains;
        }
      }
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_hsts_parse(struct hsts *h, const char *hostname,
                         const char *header)
{
  const char *p = header;
  curl_off_t expires = 0;
  bool gotma = FALSE;
  bool gotinc = FALSE;
  bool subdomains = FALSE;
  struct stsentry *sts;
  time_t now = time(NULL);

  if(Curl_host_is_ipnum(hostname))
    /* "explicit IP address identification of all forms is excluded."
       / RFC 6797 */
    return CURLE_OK;

  do {
    while(*p && ISSPACE(*p))
      p++;
    if(Curl_strncasecompare("max-age=", p, 8)) {
      bool quoted = FALSE;
      CURLofft offt;
      char *endp;

      if(gotma)
        return CURLE_BAD_FUNCTION_ARGUMENT;

      p += 8;
      while(*p && ISSPACE(*p))
        p++;
      if(*p == '\"') {
        p++;
        quoted = TRUE;
      }
      offt = curlx_strtoofft(p, &endp, 10, &expires);
      if(offt == CURL_OFFT_FLOW)
        expires = CURL_OFF_T_MAX;
      else if(offt)
        /* invalid max-age */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      p = endp;
      if(quoted) {
        if(*p != '\"')
          return CURLE_BAD_FUNCTION_ARGUMENT;
        p++;
      }
      gotma = TRUE;
    }
    else if(Curl_strncasecompare("includesubdomains", p, 17)) {
      if(gotinc)
        return CURLE_BAD_FUNCTION_ARGUMENT;
      subdomains = TRUE;
      p += 17;
      gotinc = TRUE;
    }
    else {
      /* unknown directive, do a lame attempt to skip */
      while(*p && (*p != ';'))
        p++;
    }

    while(*p && ISSPACE(*p))
      p++;
    if(*p == ';')
      p++;
  } while (*p);

  if(!gotma)
    /* max-age is mandatory */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!expires) {
    /* remove the entry if present verbatim (without subdomain match) */
    sts = Curl_hsts(h, hostname, FALSE);
    if(sts) {
      Curl_llist_remove(&h->list, &sts->node, NULL);
      hsts_free(sts);
    }
    return CURLE_OK;
  }

  if(CURL_OFF_T_MAX - now < expires)
    /* would overflow, use maximum value */
    expires = CURL_OFF_T_MAX;
  else
    expires += now;

  /* check if it already exists */
  sts = Curl_hsts(h, hostname, FALSE);
  if(sts) {
    /* just update these fields */
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
  }
  else
    return hsts_create(h, hostname, subdomains, expires);

  return CURLE_OK;
}